

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-kv-cache.cpp
# Opt level: O2

bool __thiscall
llama_kv_cache_unified::state_read_meta
          (llama_kv_cache_unified *this,llama_io_read_i *io,uint32_t cell_count,
          llama_seq_id dest_seq_id)

{
  pointer plVar1;
  pointer plVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  char *pcVar7;
  ulong n_ubatch;
  undefined8 uVar8;
  ulong uVar9;
  uint uVar10;
  llama_pos pos;
  llama_seq_id dest_seq_id_local;
  llama_kv_cache_unified *local_188;
  ulong local_180;
  uint32_t n_seq_id;
  pointer local_170;
  llama_ubatch batch;
  llama_sbatch sbatch;
  
  n_ubatch = (ulong)cell_count;
  dest_seq_id_local = dest_seq_id;
  local_180 = (ulong)cell_count;
  if (dest_seq_id == -1) {
    if (this->size < cell_count) {
      llama_log_internal(GGML_LOG_LEVEL_ERROR,"%s: not enough cells in kv cache\n","state_read_meta"
                        );
      return false;
    }
    (**(this->super_llama_kv_cache).super_llama_memory_i._vptr_llama_memory_i)(this);
    uVar9 = 0;
    while (uVar9 != n_ubatch) {
      local_170 = (this->cells).super__Vector_base<llama_kv_cell,_std::allocator<llama_kv_cell>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      local_188 = (llama_kv_cache_unified *)uVar9;
      (*io->_vptr_llama_io_read_i[3])(io,&sbatch,4);
      (*io->_vptr_llama_io_read_i[3])(io,&batch,4);
      plVar1 = local_170 + uVar9;
      plVar1->pos = (llama_pos)sbatch.n_tokens;
      for (uVar4 = 0; uVar4 < (uint)batch._0_4_; uVar4 = uVar4 + 1) {
        (*io->_vptr_llama_io_read_i[3])(io,&pos,4);
        if (pos < 0) {
          llama_log_internal(GGML_LOG_LEVEL_ERROR,
                             "%s: invalid seq_id, %d is out of range [0, inf)\n","state_read_meta");
          return false;
        }
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   &plVar1->seq_id,&pos);
        if (this->recurrent == true) {
          lVar6 = (long)pos;
          plVar2 = (this->cells).super__Vector_base<llama_kv_cell,_std::allocator<llama_kv_cell>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if (plVar2[lVar6].tail != -1) {
            llama_log_internal(GGML_LOG_LEVEL_ERROR,
                               "%s: duplicate tail for seq_id %d in cell %d and %d\n",
                               "state_read_meta",lVar6,local_188);
            return false;
          }
          plVar2[lVar6].tail = (int32_t)local_188;
        }
      }
      uVar9 = (long)local_188 + 1;
    }
    this->head = 0;
    this->used = (uint32_t)local_180;
LAB_001f1a37:
    if (this->recurrent == true) {
      uVar4 = this->head;
      plVar1 = (this->cells).super__Vector_base<llama_kv_cell,_std::allocator<llama_kv_cell>_>.
               _M_impl.super__Vector_impl_data._M_start;
      while (bVar3 = n_ubatch != 0, n_ubatch = n_ubatch - 1, bVar3) {
        plVar1[uVar4].src = uVar4;
        uVar4 = uVar4 + 1;
      }
    }
    return true;
  }
  (*(this->super_llama_kv_cache).super_llama_memory_i._vptr_llama_memory_i[2])(this);
  memset(&sbatch.ids,0,0xe0);
  llama_sbatch::reserve_ubatch(&batch,&sbatch,n_ubatch,false);
  batch.n_seqs = 1;
  local_188 = this;
  batch.n_tokens = cell_count;
  batch.n_seq_tokens = cell_count;
  for (uVar9 = 0; this = local_188, n_ubatch != uVar9; uVar9 = uVar9 + 1) {
    (*io->_vptr_llama_io_read_i[3])(io,&pos,4);
    (*io->_vptr_llama_io_read_i[3])(io,&n_seq_id,4);
    if (n_seq_id != 0) {
      llama_log_internal(GGML_LOG_LEVEL_ERROR,"%s: invalid seq_id-agnostic kv cell\n",
                         "state_read_meta");
      goto LAB_001f1b79;
    }
    batch.pos[uVar9] = pos;
  }
  *batch.n_seq_id = 1;
  *batch.seq_id = &dest_seq_id_local;
  bVar3 = find_slot(local_188,&batch);
  uVar9 = local_180;
  if (!bVar3) {
    llama_log_internal(GGML_LOG_LEVEL_ERROR,"%s: failed to find available cells in kv cache\n",
                       "state_read_meta");
LAB_001f1b79:
    llama_sbatch::~llama_sbatch(&sbatch);
    return false;
  }
  (*(this->super_llama_kv_cache).super_llama_memory_i._vptr_llama_memory_i[10])(this);
  uVar4 = this->head;
  uVar5 = uVar4 + (int)uVar9;
  if (this->size < uVar5) {
    pcVar7 = "head + cell_count <= size";
    uVar8 = 0x449;
  }
  else {
    plVar1 = (this->cells).super__Vector_base<llama_kv_cell,_std::allocator<llama_kv_cell>_>._M_impl
             .super__Vector_impl_data._M_start;
    if (plVar1[uVar4].pos == *batch.pos) {
      uVar10 = (int)uVar9 - 1;
      if (plVar1[uVar5 - 1].pos == batch.pos[uVar10]) {
        bVar3 = llama_kv_cell::has_seq_id(plVar1 + uVar4,&dest_seq_id_local);
        if (bVar3) {
          bVar3 = llama_kv_cell::has_seq_id
                            ((this->cells).
                             super__Vector_base<llama_kv_cell,_std::allocator<llama_kv_cell>_>.
                             _M_impl.super__Vector_impl_data._M_start + (uVar10 + this->head),
                             &dest_seq_id_local);
          if (bVar3) {
            llama_sbatch::~llama_sbatch(&sbatch);
            goto LAB_001f1a37;
          }
          pcVar7 = "cells[head + cell_count - 1].has_seq_id(dest_seq_id)";
          uVar8 = 0x44d;
        }
        else {
          pcVar7 = "cells[head].has_seq_id(dest_seq_id)";
          uVar8 = 0x44c;
        }
      }
      else {
        pcVar7 = "cells[head + cell_count - 1].pos == batch.pos[cell_count - 1]";
        uVar8 = 1099;
      }
    }
    else {
      pcVar7 = "cells[head].pos == batch.pos[0]";
      uVar8 = 0x44a;
    }
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-kv-cache.cpp"
             ,uVar8,"GGML_ASSERT(%s) failed",pcVar7);
}

Assistant:

bool llama_kv_cache_unified::state_read_meta(llama_io_read_i & io, uint32_t cell_count, llama_seq_id dest_seq_id) {
    if (dest_seq_id != -1) {
        // single sequence

        seq_rm(dest_seq_id, -1, -1);

        llama_sbatch sbatch;
        llama_ubatch batch = sbatch.reserve_ubatch(cell_count, /* has_embd */ false);

        batch.n_tokens = cell_count;
        batch.n_seq_tokens = cell_count;
        batch.n_seqs = 1;

        for (uint32_t i = 0; i < cell_count; ++i) {
            llama_pos pos;
            uint32_t n_seq_id;

            io.read_to(&pos,      sizeof(pos));
            io.read_to(&n_seq_id, sizeof(n_seq_id));

            if (n_seq_id != 0) {
                LLAMA_LOG_ERROR("%s: invalid seq_id-agnostic kv cell\n", __func__);
                return false;
            }

            batch.pos[i] = pos;
        }
        batch.n_seq_id[0] = 1;
        batch.seq_id[0] = &dest_seq_id;
        if (!find_slot(batch)) {
            LLAMA_LOG_ERROR("%s: failed to find available cells in kv cache\n", __func__);
            return false;
        }
        commit();

        // DEBUG CHECK: kv.head should be our first cell, kv.head + cell_count - 1 should be our last cell (verify seq_id and pos values)
        // Assume that this is one contiguous block of cells
        GGML_ASSERT(head + cell_count <= size);
        GGML_ASSERT(cells[head].pos == batch.pos[0]);
        GGML_ASSERT(cells[head + cell_count - 1].pos == batch.pos[cell_count - 1]);
        GGML_ASSERT(cells[head].has_seq_id(dest_seq_id));
        GGML_ASSERT(cells[head + cell_count - 1].has_seq_id(dest_seq_id));
    } else {
        // whole KV cache restore

        if (cell_count > size) {
            LLAMA_LOG_ERROR("%s: not enough cells in kv cache\n", __func__);
            return false;
        }

        clear();

        for (uint32_t i = 0; i < cell_count; ++i) {
            llama_kv_cell & cell = cells[i];

            llama_pos pos;
            uint32_t  n_seq_id;

            io.read_to(&pos,      sizeof(pos));
            io.read_to(&n_seq_id, sizeof(n_seq_id));

            cell.pos = pos;

            for (uint32_t j = 0; j < n_seq_id; ++j) {
                llama_seq_id seq_id;
                io.read_to(&seq_id, sizeof(seq_id));

                // TODO: llama_kv_cache_unified should have a notion of max sequences
                //if (seq_id < 0 || (uint32_t) seq_id >= llama_n_seq_max(ctx)) {
                if (seq_id < 0) {
                    //LLAMA_LOG_ERROR("%s: invalid seq_id, %d is out of range [0, %u)\n", __func__, seq_id, llama_n_seq_max(ctx));
                    LLAMA_LOG_ERROR("%s: invalid seq_id, %d is out of range [0, inf)\n", __func__, seq_id);
                    return false;
                }

                cell.seq_id.insert(seq_id);

                if (recurrent) {
                    int32_t & tail = cells[seq_id].tail;
                    if (tail != -1) {
                        LLAMA_LOG_ERROR("%s: duplicate tail for seq_id %d in cell %d and %d\n", __func__, seq_id, i, tail);
                        return false;
                    }
                    tail = i;
                }
            }
        }

        head = 0;
        used = cell_count;
    }

    if (recurrent) {
        for (uint32_t i = 0; i < cell_count; ++i) {
            uint32_t cell_id = head + i;
            // make sure the recurrent states will keep their restored state
            cells[cell_id].src = cell_id;
        }
    }

    return true;
}